

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O2

int align_buffer_end(flatcc_builder_t *B,uint16_t *align,uint16_t block_align,int is_nested)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  undefined6 in_register_00000012;
  uint uVar5;
  flatcc_iov_state_t local_90;
  
  uVar4 = (uint)CONCAT62(in_register_00000012,block_align);
  if (uVar4 == 0) {
    uVar4 = *(int *)&B->block_align + (uint)((short)*(int *)&B->block_align == 0);
  }
  uVar1 = *align;
  uVar5 = 4;
  if (4 < uVar1) {
    uVar5 = (uint)uVar1;
  }
  uVar3 = (uint)CONCAT11((char)(uVar1 >> 8),3 < uVar1);
  uVar2 = uVar4;
  if ((ushort)uVar4 < (ushort)uVar5) {
    uVar2 = uVar5;
  }
  if (3 >= uVar1 || (ushort)uVar5 < (ushort)uVar4) {
    *align = (uint16_t)uVar2;
  }
  if ((is_nested == 0) && (uVar3 = (uVar2 & 0xffff) - 1 & B->emit_end, uVar3 != 0)) {
    local_90.len = (size_t)uVar3;
    local_90.iov[0].iov_base = "";
    local_90.count = 1;
    local_90.iov[0].iov_len = local_90.len;
    uVar3 = emit_back(B,&local_90);
    if (uVar3 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                    ,0x2cd,"int align_buffer_end(flatcc_builder_t *, uint16_t *, uint16_t, int)");
    }
  }
  return uVar3;
}

Assistant:

static int align_buffer_end(flatcc_builder_t *B, uint16_t *align, uint16_t block_align, int is_nested)
{
    size_t end_pad;
    iov_state_t iov;

    block_align = block_align ? block_align : B->block_align ? B->block_align : 1;
    get_min_align(align, field_size);
    get_min_align(align, block_align);
    /* Pad end of buffer to multiple. */
    if (!is_nested) {
        end_pad = back_pad(B, *align);
        if (end_pad) {
            init_iov();
            push_iov(_pad, end_pad);
            if (0 == emit_back(B, &iov)) {
                check(0, "emitter rejected buffer content");
                return -1;
            }
        }
    }
    return 0;
}